

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O3

int cgpr_mt(custom_function *funcpt,custom_gradient *funcgrad,double *xc,int N,double *dx,
           double maxstep,int MAXITER,int *niter,double eps,double gtol,double ftol,double xtol,
           double *xf)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *p;
  double *f;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_0000008c;
  size_t __size;
  uint uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar8;
  double *__x;
  double local_e0;
  double alpha;
  double *local_d0;
  double *local_c8;
  size_t local_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  double local_a0;
  double local_98;
  double *local_90;
  custom_gradient *local_88;
  double local_80;
  double *local_78;
  double *local_70;
  custom_function *local_68;
  double local_60;
  int local_54;
  double local_50;
  double fxf;
  double *local_40;
  double *local_38;
  
  local_a8 = CONCAT44(in_register_0000008c,MAXITER);
  alpha = xtol;
  local_a0 = ftol;
  local_98 = gtol;
  local_88 = funcgrad;
  local_80 = eps;
  local_68 = funcpt;
  fxf = maxstep;
  local_40 = dx;
  local_38 = xc;
  local_78 = (double *)malloc(0x40);
  __size = (long)N << 3;
  p = (double *)malloc(__size);
  f = (double *)malloc(__size);
  local_90 = (double *)malloc(__size);
  pdVar4 = (double *)malloc(__size);
  *niter = 0;
  if (local_80 < 0.0) {
    local_60 = sqrt(local_80);
  }
  else {
    local_60 = SQRT(local_80);
  }
  local_e0 = 1.0;
  local_70 = pdVar4;
  if (N < 1) {
    dVar1 = 0.0;
    __x = (double *)0x0;
    if (0.0 < fxf) {
      iVar2 = grad_fd(local_68,local_88,pdVar4,N,local_40,local_60,f);
      iVar3 = 0;
      if (iVar2 == 0xf) {
        iVar3 = 0xf;
      }
      goto LAB_0014b1a3;
    }
LAB_0014b0cf:
    if (dVar1 < 0.0) {
      local_38 = __x;
      fxf = sqrt(dVar1);
      __x = local_38;
    }
    else {
      fxf = SQRT(dVar1);
    }
    if ((double)__x < 0.0) {
      dVar1 = sqrt((double)__x);
    }
    else {
      dVar1 = SQRT((double)__x);
    }
    if (fxf <= dVar1) {
      fxf = dVar1 * 1000.0;
    }
    else {
      fxf = fxf * 1000.0;
    }
  }
  else {
    memcpy(pdVar4,local_38,(ulong)(uint)N * 8);
    __x = (double *)0x0;
    if (fxf <= 0.0) {
      uVar5 = 0;
      dVar1 = 0.0;
      do {
        dVar8 = local_40[uVar5];
        dVar1 = dVar1 + dVar8 * dVar8;
        __x = (double *)((double)__x + dVar8 * pdVar4[uVar5] * dVar8 * pdVar4[uVar5]);
        uVar5 = uVar5 + 1;
      } while ((uint)N != uVar5);
      goto LAB_0014b0cf;
    }
  }
  iVar2 = grad_fd(local_68,local_88,pdVar4,N,local_40,local_60,f);
  iVar3 = 0;
  if (iVar2 == 0xf) {
    iVar3 = 0xf;
  }
  if (0 < N) {
    memcpy(xf,pdVar4,(ulong)(uint)N * 8);
    uVar5 = 0;
    do {
      p[uVar5] = -f[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)N != uVar5);
  }
LAB_0014b1a3:
  local_b8 = (*local_68->funcpt)(local_70,N,local_68->params);
  uStack_b0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  local_50 = local_b8;
  if (1.79769313486232e+308 <= ABS(local_b8)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    iVar3 = 0xf;
  }
  if (NAN(local_b8)) {
    printf("Program Exiting as the function returns NaN");
    iVar3 = 0xf;
  }
  else if (iVar3 == 0) {
    local_d0 = local_78 + 1;
    local_c8 = local_78 + 3;
    uVar5 = (ulong)(uint)N;
    local_c0 = uVar5 * 8;
    local_38 = (double *)0x0;
    do {
      iVar3 = *niter;
      if ((int)local_a8 <= iVar3) {
LAB_0014b48d:
        iVar3 = (uint)((int)local_a8 <= iVar3) << 2;
        break;
      }
      *niter = iVar3 + 1;
      mmult(f,f,local_78,1,N,1);
      pdVar4 = local_70;
      if (0 < N) {
        memcpy(local_90,f,local_c0);
      }
      iVar3 = lnsrchmt(local_68,local_88,pdVar4,&local_50,f,&local_e0,p,N,local_40,fxf,(int)local_a8
                       ,local_60,local_a0,local_98,alpha,xf);
      if (iVar3 == 100) {
        printf("The Linesearch Algorithm didn\'t converge");
        iVar3 = *niter;
        goto LAB_0014b48d;
      }
      uVar7 = (int)local_38 + 1;
      local_54 = iVar3;
      mmult(f,f,local_d0,1,N,1);
      mmult(local_90,f,local_c8,1,N,1);
      dVar8 = (local_78[1] - local_78[3]) / *local_78;
      dVar1 = 0.0;
      if (0.0 <= dVar8) {
        dVar1 = dVar8;
      }
      local_78[2] = dVar1;
      if (uVar7 == N) {
        if (N < 1) {
          local_38 = (double *)0x0;
          goto LAB_0014b433;
        }
        uVar6 = 0;
        do {
          p[uVar6] = -f[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        local_38 = (double *)0x0;
LAB_0014b3d5:
        iVar3 = stopcheck2_mt(local_50,N,local_b8,f,local_40,local_80,local_98,local_a0,local_54);
        local_b8 = local_50;
        uStack_b0 = 0;
        if (0 < N) {
          memcpy(local_70,xf,local_c0);
        }
      }
      else {
        local_38 = (double *)(ulong)uVar7;
        if (0 < N) {
          uVar6 = 0;
          do {
            p[uVar6] = p[uVar6] * dVar1 - f[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
          goto LAB_0014b3d5;
        }
LAB_0014b433:
        iVar3 = stopcheck2_mt(local_50,N,local_b8,f,local_40,local_80,local_98,local_a0,local_54);
        local_b8 = local_50;
        uStack_b0 = 0;
      }
    } while (iVar3 == 0);
  }
  free(local_78);
  free(p);
  free(f);
  free(local_90);
  free(local_70);
  return iVar3;
}

Assistant:

int cgpr_mt(custom_function *funcpt, custom_gradient *funcgrad, double *xc, int N, double *dx,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double ftol,double xtol,double *xf) {
	int i, rcode, retval, k, restart,gfdcode;
	int siter;
	double *xi,*temp, *rk, *pk, *jac, *jacf, *apk;
	double fsval,fxf,eps2,fo;
	double dt1, dt2,alpha;

	temp = (double*)malloc(sizeof(double)* 8);
	rk = (double*)malloc(sizeof(double)*N);
	pk = (double*)malloc(sizeof(double)*N);
	apk = (double*)malloc(sizeof(double)*N);
	jac = (double*)malloc(sizeof(double)*N);
	jacf = (double*)malloc(sizeof(double)*N);
	xi = (double*)malloc(sizeof(double)*N);

	*niter = 0;
	k = 0;
	rcode = 0;
	restart = N;
	siter = MAXITER;
	eps2 = sqrt(eps);
	gfdcode = 0;

	//xtol = 1.0e-15;
	//ftol = 1e-10;
	//gtol = 1e-05;

	// Values that may not be needed

	fsval = 1.0;
	alpha = 1.0;

	for (i = 0; i < N; ++i) {
		xi[i] = xc[i];
	}
	
	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);
		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}



	gfdcode = grad_fd(funcpt,funcgrad, xi, N, dx,eps2, jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	for (i = 0; i < N; ++i) {
		pk[i] = -jac[i];
		xf[i] = xi[i];
	}

	fxf = FUNCPT_EVAL(funcpt,xi, N);

	if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fxf != fxf) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	if (restart < N) {
		restart = N;
	}

	fo = fxf;


	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		k++;

		mmult(jac, jac, temp, 1, N, 1);
		for (i = 0; i < N; ++i) {
			jacf[i] = jac[i];
		}

		retval = lnsrchmt(funcpt,funcgrad, xi,&fxf,jac,&alpha, pk, N, dx, maxstep,MAXITER,eps2, ftol, gtol, xtol, xf);
		if (retval == 100) {
			printf("The Linesearch Algorithm didn't converge");
			break;
		}
		//mdisplay(xf,1,N);
		
		//mdisplay(xf, 1, N);
		//grad_fd(funcpt, xf, N, dx, jacf);
		mmult(jac, jac, temp + 1, 1, N, 1);
		mmult(jacf, jac, temp + 3, 1, N, 1);
		temp[2] = (temp[1] - temp[3]) / temp[0]; // beta

		if (temp[2] < 0) {
			temp[2] = 0;
		}
		if (k == restart) {
			for (i = 0; i < N; ++i) {
				pk[i] = -jac[i];
			}
			k = 0;
		}
		else {
			for (i = 0; i < N; ++i) {
				pk[i] = temp[2] * pk[i] - jac[i];
			}
		}
		

		rcode = stopcheck2_mt(fxf,N,fo,jac,dx,eps,gtol,ftol,retval);
		fo = fxf;
		for (i = 0; i < N; ++i) {
			xi[i] = xf[i];
		}
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}

	free(temp);
	free(rk);
	free(pk);
	free(jac);
	free(apk);
	free(jacf);
	free(xi);

	return rcode;
}